

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O0

int CMpbio_get_port_callback(void *client_data)

{
  int iVar1;
  __pid_t _Var2;
  attr_list p_Var3;
  CManager cm_00;
  pthread_t pVar4;
  long in_RDI;
  timespec ts_1;
  timespec ts;
  int int_port_num;
  atom_t CM_IP_PORT;
  attr_list contact_attrs;
  CManager cm;
  CManager_conflict in_stack_ffffffffffffff98;
  FILE *pFVar5;
  timespec local_48;
  timespec local_38;
  uint local_28;
  CMTraceType trace_type;
  uint local_4;
  
  p_Var3 = INT_CMget_contact_list(in_stack_ffffffffffffff98);
  trace_type = ~CMAlwaysTrace;
  if (p_Var3 == (attr_list)0x0) {
    CMinternal_listen((CManager_conflict)ts.tv_nsec,(attr_list)ts.tv_sec,ts_1.tv_nsec._4_4_);
  }
  cm_00 = (CManager)INT_CMget_contact_list(in_stack_ffffffffffffff98);
  if (trace_type == ~CMAlwaysTrace) {
    trace_type = attr_atom_from_string("IP_PORT");
  }
  iVar1 = get_int_attr(cm_00,trace_type,&local_28);
  if (iVar1 == 0) {
    iVar1 = CMtrace_val[6];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(cm_00,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"CMpbio port callback found no IP_PORT attribute\n");
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    local_4 = 0;
  }
  else {
    iVar1 = CMtrace_val[6];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(cm_00,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"CMpbio port callback returning %d\n",(ulong)local_28);
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

extern int CMpbio_get_port_callback(void *client_data)
{
    CManager cm = (CManager) client_data;
    attr_list contact_attrs = INT_CMget_contact_list(cm);
    atom_t CM_IP_PORT = -1;
    int int_port_num;

    if (contact_attrs == NULL) {
	CMinternal_listen(cm, NULL, 1);
    }
    contact_attrs = INT_CMget_contact_list(cm);
    if (CM_IP_PORT == -1) {
	CM_IP_PORT = attr_atom_from_string("IP_PORT");
    }
    if (!get_int_attr(contact_attrs, CM_IP_PORT, &int_port_num)) {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio port callback found no IP_PORT attribute\n");
	return 0;
    }
    CMtrace_out(cm, CMFormatVerbose, "CMpbio port callback returning %d\n", int_port_num);
    return int_port_num;
}